

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Export *this_00;
  char *pcVar1;
  Offset OVar2;
  ExportModuleField *pEVar3;
  size_t sVar4;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> field;
  Location loc;
  Location loc_1;
  ExportModuleField *local_d0;
  ExternalKind local_c4;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_c0;
  string_view local_b8;
  Var local_a8;
  Location local_58;
  
  local_b8.size_ = name.size_;
  local_b8.data_ = name.data_;
  local_a8.loc.field_1.field_0.line = 0;
  local_a8.loc.field_1.field_0.first_column = 0;
  local_a8.loc.field_1.field_0.last_column = 0;
  local_a8.loc.filename.data_ = (char *)0x0;
  local_a8.loc.filename.size_._0_4_ = 0;
  local_a8.loc.filename.size_._4_4_ = 0;
  pcVar1 = this->filename_;
  local_c4 = kind;
  sVar4 = strlen(pcVar1);
  local_a8.loc.filename.size_._0_4_ = (undefined4)sVar4;
  local_a8.loc.filename.size_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_a8.loc.field_1.field_0.line = (int)OVar2;
  local_a8.loc.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  local_a8.loc.filename.data_ = pcVar1;
  MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_d0,&local_a8.loc);
  pEVar3 = local_d0;
  this_00 = &local_d0->export_;
  string_view::to_string_abi_cxx11_((string *)&local_a8,&local_b8);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_a8.loc.filename.data_ !=
      &local_a8.loc.field_1) {
    operator_delete(local_a8.loc.filename.data_);
  }
  local_58.field_1.field_0.line = 0;
  local_58.field_1.field_0.first_column = 0;
  local_58.field_1.field_0.last_column = 0;
  local_58.filename.data_ = (char *)0x0;
  local_58.filename.size_._0_4_ = 0;
  local_58.filename.size_._4_4_ = 0;
  pcVar1 = this->filename_;
  sVar4 = strlen(pcVar1);
  local_58.filename.size_._0_4_ = (undefined4)sVar4;
  local_58.filename.size_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_58.field_1.field_0.line = (int)OVar2;
  local_58.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  local_58.filename.data_ = pcVar1;
  Var::Var(&local_a8,item_index,&local_58);
  Var::operator=(&(pEVar3->export_).var,&local_a8);
  Var::~Var(&local_a8);
  (pEVar3->export_).kind = local_c4;
  local_c0._M_head_impl = local_d0;
  local_d0 = (ExportModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_c0);
  if (local_c0._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_c0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_c0._M_head_impl = (ExportModuleField *)0x0;
  if (local_d0 != (ExportModuleField *)0x0) {
    (**(code **)(*(long *)local_d0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}